

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

uint getArchPointerBitWidth(ArchType Arch)

{
  uint local_c;
  ArchType Arch_local;
  
  switch(Arch) {
  case UnknownArch:
    local_c = 0;
    break;
  case arm:
  case armeb:
  case arc:
  case hexagon:
  case mips:
  case mipsel:
  case nios2:
  case ppc:
  case r600:
  case riscv32:
  case sparc:
  case sparcel:
  case tce:
  case tcele:
  case thumb:
  case thumbeb:
  case x86:
  case xcore:
  case nvptx:
  case le32:
  case amdil:
  case hsail:
  case spir:
  case kalimba:
  case shave:
  case lanai:
  case wasm32:
  case renderscript32:
    local_c = 0x20;
    break;
  case aarch64:
  case aarch64_be:
  case bpfel:
  case bpfeb:
  case mips64:
  case mips64el:
  case ppc64:
  case ppc64le:
  case amdgcn:
  case riscv64:
  case sparcv9:
  case systemz:
  case x86_64:
  case nvptx64:
  case le64:
  case amdil64:
  case hsail64:
  case spir64:
  case wasm64:
  case LastArchType:
    local_c = 0x40;
    break;
  case avr:
  case msp430:
    local_c = 0x10;
    break;
  default:
    llvm::llvm_unreachable_internal
              ("Invalid architecture value",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x4da);
  }
  return local_c;
}

Assistant:

static unsigned getArchPointerBitWidth(llvm::Triple::ArchType Arch) {
  switch (Arch) {
  case llvm::Triple::UnknownArch:
    return 0;

  case llvm::Triple::avr:
  case llvm::Triple::msp430:
    return 16;

  case llvm::Triple::arc:
  case llvm::Triple::arm:
  case llvm::Triple::armeb:
  case llvm::Triple::hexagon:
  case llvm::Triple::le32:
  case llvm::Triple::mips:
  case llvm::Triple::mipsel:
  case llvm::Triple::nios2:
  case llvm::Triple::nvptx:
  case llvm::Triple::ppc:
  case llvm::Triple::r600:
  case llvm::Triple::riscv32:
  case llvm::Triple::sparc:
  case llvm::Triple::sparcel:
  case llvm::Triple::tce:
  case llvm::Triple::tcele:
  case llvm::Triple::thumb:
  case llvm::Triple::thumbeb:
  case llvm::Triple::x86:
  case llvm::Triple::xcore:
  case llvm::Triple::amdil:
  case llvm::Triple::hsail:
  case llvm::Triple::spir:
  case llvm::Triple::kalimba:
  case llvm::Triple::lanai:
  case llvm::Triple::shave:
  case llvm::Triple::wasm32:
  case llvm::Triple::renderscript32:
    return 32;

  case llvm::Triple::aarch64:
  case llvm::Triple::aarch64_be:
  case llvm::Triple::amdgcn:
  case llvm::Triple::bpfel:
  case llvm::Triple::bpfeb:
  case llvm::Triple::le64:
  case llvm::Triple::mips64:
  case llvm::Triple::mips64el:
  case llvm::Triple::nvptx64:
  case llvm::Triple::ppc64:
  case llvm::Triple::ppc64le:
  case llvm::Triple::riscv64:
  case llvm::Triple::sparcv9:
  case llvm::Triple::systemz:
  case llvm::Triple::x86_64:
  case llvm::Triple::amdil64:
  case llvm::Triple::hsail64:
  case llvm::Triple::spir64:
  case llvm::Triple::wasm64:
  case llvm::Triple::renderscript64:
    return 64;
  }
  llvm_unreachable("Invalid architecture value");
}